

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::
DoSimdLoadExtend<wabt::interp::Simd<long,(unsigned_char)2>,wabt::interp::Simd<int,(unsigned_char)2>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  u8 i;
  RunResult RVar1;
  long lVar2;
  Simd<int,_(unsigned_char)__x02_> val;
  Simd<long,_(unsigned_char)__x02_> result;
  
  RVar1 = Load<wabt::interp::Simd<int,(unsigned_char)2>>(this,instr,&val,out_trap);
  if (RVar1 == Ok) {
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      result.v[lVar2] = (long)val.v[lVar2];
    }
    Push(this,(Value)result.v);
    RVar1 = Ok;
  }
  else {
    RVar1 = Trap;
  }
  return RVar1;
}

Assistant:

RunResult Thread::DoSimdLoadExtend(Instr instr, Trap::Ptr* out_trap) {
  T val;
  if (Load<T>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result.v[i] = val.v[i];
  }
  Push(result);
  return RunResult::Ok;
}